

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O1

void __thiscall
QHttpNetworkConnectionPrivate::removeReply
          (QHttpNetworkConnectionPrivate *this,QHttpNetworkReply *reply)

{
  QObject *pQVar1;
  QHttpNetworkConnectionChannel *pQVar2;
  long lVar3;
  QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
  *pQVar4;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar5;
  QHttpNetworkReply *pQVar6;
  QAbstractProtocolHandler *this_00;
  const_iterator cVar7;
  bool bVar8;
  uint uVar9;
  const_iterator afirst;
  const_iterator alast;
  QHttpNetworkReply **ppQVar10;
  long lVar11;
  int iVar12;
  qsizetype i;
  QHttpNetworkRequest *pQVar13;
  ulong i_00;
  long in_FS_OFFSET;
  R_conflict h;
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *local_80;
  QHttpNetworkRequest local_78;
  QHttpNetworkReply *local_68;
  QHttpNetworkRequest local_58;
  QMetaTypeInterface *local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QObject **)&this->field_0x8;
  iVar12 = this->activeChannelCount;
  if (0 < (long)iVar12) {
    pQVar2 = this->channels;
    lVar11 = 0;
    do {
      if (pQVar2[lVar11].reply == reply) {
        pQVar2[lVar11].reply = (QHttpNetworkReply *)0x0;
        this_00 = pQVar2[lVar11].protocolHandler._M_t.
                  super___uniq_ptr_impl<QAbstractProtocolHandler,_std::default_delete<QAbstractProtocolHandler>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_QAbstractProtocolHandler_*,_std::default_delete<QAbstractProtocolHandler>_>
                  .super__Head_base<0UL,_QAbstractProtocolHandler_*,_false>._M_head_impl;
        if (this_00 != (QAbstractProtocolHandler *)0x0) {
          QAbstractProtocolHandler::setReply(this_00,(QHttpNetworkReply *)0x0);
        }
        QUrl::QUrl((QUrl *)&local_78);
        QHttpNetworkRequest::QHttpNetworkRequest(&local_58,(QUrl *)&local_78,Get,NormalPriority);
        pQVar13 = &local_58;
        QHttpNetworkRequest::operator=(&this->channels[lVar11].request,&local_58);
        iVar12 = (int)pQVar13;
        QHttpNetworkRequest::~QHttpNetworkRequest(&local_58);
        QUrl::~QUrl((QUrl *)&local_78);
        this->channels[lVar11].resendCurrent = false;
        bVar8 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)reply);
        if ((!bVar8) && (this->channels[lVar11].alreadyPipelinedRequests.d.size != 0)) {
          QHttpNetworkConnectionChannel::requeueCurrentlyPipelinedRequests
                    ((QHttpNetworkConnectionChannel *)(this->channels + lVar11));
        }
        bVar8 = QHttpNetworkReplyPrivate::isConnectionCloseEnabled
                          (*(QHttpNetworkReplyPrivate **)&reply->field_0x8);
        if ((bVar8) || (bVar8 = QHttpNetworkReply::isFinished((QHttpNetworkReply *)reply), !bVar8))
        {
          bVar8 = QHttpNetworkReply::isAborted((QHttpNetworkReply *)reply);
          if (bVar8) {
            QHttpNetworkConnectionChannel::abort
                      ((QHttpNetworkConnectionChannel *)(this->channels + lVar11));
          }
          else {
            QHttpNetworkConnectionChannel::close
                      ((QHttpNetworkConnectionChannel *)(this->channels + lVar11),iVar12);
          }
        }
LAB_00204ade:
        local_58.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
        local_58.d.d.ptr =
             (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)
             (QHttpNetworkRequestPrivate *)0x0;
        local_48[0] = (QMetaTypeInterface *)0x0;
        QMetaObject::invokeMethodImpl
                  (pQVar1,"_q_startNextRequest",QueuedConnection,1,(void **)&local_58,
                   (char **)&local_58.d,local_48);
        goto LAB_00204b1a;
      }
      lVar3 = pQVar2[lVar11].alreadyPipelinedRequests.d.size;
      if (lVar3 != 0) {
        ppQVar10 = &(pQVar2[lVar11].alreadyPipelinedRequests.d.ptr)->second;
        i = 0;
        do {
          if (*ppQVar10 == reply) {
            QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt
                      (&pQVar2[lVar11].alreadyPipelinedRequests,i);
            QHttpNetworkConnectionChannel::requeueCurrentlyPipelinedRequests
                      ((QHttpNetworkConnectionChannel *)(this->channels + lVar11));
            pQVar6 = this->channels[lVar11].reply;
            if (pQVar6 != (QHttpNetworkReply *)0x0) {
              *(undefined1 *)(*(long *)&pQVar6->field_0x8 + 0x13a) = 1;
            }
            goto LAB_00204ade;
          }
          i = i + 1;
          ppQVar10 = ppQVar10 + 3;
        } while (lVar3 != i);
      }
      pQVar4 = pQVar2[lVar11].h2RequestsToSend.d.d.ptr;
      cVar7._M_node = &(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar4 == (QMapData<std::multimap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>_>_>_>
                     *)0x0) {
        afirst._M_node = (_Base_ptr)0x0;
        cVar7._M_node = (_Base_ptr)0x0;
      }
      else {
        afirst._M_node =
             *(_Base_ptr *)((long)&(pQVar4->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      }
      for (; (afirst._M_node != cVar7._M_node &&
             (*(QHttpNetworkReply **)((long)afirst._M_node + 0x38) != reply));
          afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node)) {
      }
      if (afirst._M_node != cVar7._M_node) {
        alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
        QMultiMap<int,_std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
                  (&pQVar2[lVar11].h2RequestsToSend,(const_iterator)afirst._M_node,alast);
        goto LAB_00204ade;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != iVar12);
  }
  lVar11 = (this->highPriorityQueue).d.size;
  if ((lVar11 != 0) && (uVar9 = (int)lVar11 - 1, -1 < (int)uVar9)) {
    local_80 = &this->highPriorityQueue;
    lVar11 = (ulong)uVar9 * 0x18;
    i_00 = (ulong)uVar9;
    do {
      local_68 = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d.ptr =
           (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
      ppVar5 = (this->highPriorityQueue).d.ptr;
      QHttpNetworkRequest::QHttpNetworkRequest
                (&local_78,
                 (QHttpNetworkRequest *)
                 ((long)&(ppVar5->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + lVar11)
                );
      local_68 = *(QHttpNetworkReply **)((long)&ppVar5->second + lVar11);
      if (local_68 == reply) goto LAB_00204b3d;
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_78);
      lVar11 = lVar11 + -0x18;
      bVar8 = 0 < (long)i_00;
      i_00 = i_00 - 1;
    } while (bVar8);
  }
  lVar11 = (this->lowPriorityQueue).d.size;
  if ((lVar11 != 0) && (uVar9 = (int)lVar11 - 1, -1 < (int)uVar9)) {
    local_80 = &this->lowPriorityQueue;
    lVar11 = (ulong)uVar9 * 0x18;
    i_00 = (ulong)uVar9;
    do {
      local_68 = (QHttpNetworkReply *)&DAT_aaaaaaaaaaaaaaaa;
      local_78.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_78.d.d.ptr =
           (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
      ppVar5 = (this->lowPriorityQueue).d.ptr;
      QHttpNetworkRequest::QHttpNetworkRequest
                (&local_78,
                 (QHttpNetworkRequest *)
                 ((long)&(ppVar5->first).super_QHttpNetworkHeader._vptr_QHttpNetworkHeader + lVar11)
                );
      local_68 = *(QHttpNetworkReply **)((long)&ppVar5->second + lVar11);
      if (local_68 == reply) goto LAB_00204b3d;
      QHttpNetworkRequest::~QHttpNetworkRequest(&local_78);
      lVar11 = lVar11 + -0x18;
      bVar8 = 0 < (long)i_00;
      i_00 = i_00 - 1;
    } while (bVar8);
  }
LAB_00204b1a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
LAB_00204b3d:
  QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::removeAt(local_80,i_00);
  local_58.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = (_func_int **)0x0;
  local_58.d.d.ptr =
       (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)(QHttpNetworkRequestPrivate *)0x0;
  local_48[0] = (QMetaTypeInterface *)0x0;
  QMetaObject::invokeMethodImpl
            (pQVar1,"_q_startNextRequest",QueuedConnection,1,(void **)&local_58,(char **)&local_58.d
             ,local_48);
  QHttpNetworkRequest::~QHttpNetworkRequest(&local_78);
  goto LAB_00204b1a;
}

Assistant:

void QHttpNetworkConnectionPrivate::removeReply(QHttpNetworkReply *reply)
{
    Q_Q(QHttpNetworkConnection);

    // check if the reply is currently being processed or it is pipelined in
    for (int i = 0; i < activeChannelCount; ++i) {
        // is the reply associated the currently processing of this channel?
        if (channels[i].reply == reply) {
            channels[i].reply = nullptr;
            if (channels[i].protocolHandler)
                channels[i].protocolHandler->setReply(nullptr);
            channels[i].request = QHttpNetworkRequest();
            channels[i].resendCurrent = false;

            if (!reply->isFinished() && !channels[i].alreadyPipelinedRequests.isEmpty()) {
                // the reply had to be prematurely removed, e.g. it was not finished
                // therefore we have to requeue the already pipelined requests.
                channels[i].requeueCurrentlyPipelinedRequests();
            }

            // if HTTP mandates we should close
            // or the reply is not finished yet, e.g. it was aborted
            // we have to close that connection
            if (reply->d_func()->isConnectionCloseEnabled() || !reply->isFinished()) {
                if (reply->isAborted()) {
                    channels[i].abort();
                } else {
                    channels[i].close();
                }
            }

            QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }

        // is the reply inside the pipeline of this channel already?
        for (int j = 0; j < channels[i].alreadyPipelinedRequests.size(); j++) {
            if (channels[i].alreadyPipelinedRequests.at(j).second == reply) {
               // Remove that HttpMessagePair
               channels[i].alreadyPipelinedRequests.removeAt(j);

               channels[i].requeueCurrentlyPipelinedRequests();

               // Since some requests had already been pipelined, but we removed
               // one and re-queued the others
               // we must force a connection close after the request that is
               // currently in processing has been finished.
               if (channels[i].reply)
                   channels[i].reply->d_func()->forceConnectionCloseEnabled = true;

               QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
               return;
            }
        }
        // is the reply inside the H2 pipeline of this channel already?
        const auto foundReply = [reply](const HttpMessagePair &pair) {
            return pair.second == reply;
        };
        auto &seq = channels[i].h2RequestsToSend;
        const auto end = seq.cend();
        auto it = std::find_if(seq.cbegin(), end, foundReply);
        if (it != end) {
            seq.erase(it);
            QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    }
    // remove from the high priority queue
    if (!highPriorityQueue.isEmpty()) {
        for (int j = highPriorityQueue.size() - 1; j >= 0; --j) {
            HttpMessagePair messagePair = highPriorityQueue.at(j);
            if (messagePair.second == reply) {
                highPriorityQueue.removeAt(j);
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                return;
            }
        }
    }
    // remove from the low priority queue
    if (!lowPriorityQueue.isEmpty()) {
        for (int j = lowPriorityQueue.size() - 1; j >= 0; --j) {
            HttpMessagePair messagePair = lowPriorityQueue.at(j);
            if (messagePair.second == reply) {
                lowPriorityQueue.removeAt(j);
                QMetaObject::invokeMethod(q, "_q_startNextRequest", Qt::QueuedConnection);
                return;
            }
        }
    }
}